

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void predict_or_learn_bandit_adf<true>(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  bool bVar1;
  uint32_t uVar2;
  action_score *paVar3;
  undefined8 uVar4;
  int in_ECX;
  long in_RDX;
  warm_cb *in_RDI;
  float fVar5;
  stringstream __msg;
  multi_learner *in_stack_00000048;
  warm_cb *in_stack_00000050;
  action_scores *a_s;
  cb_class *cl;
  uint32_t chosen_action;
  example *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe34;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffe38;
  warm_cb *in_stack_fffffffffffffe40;
  stringstream local_1b8 [16];
  stringstream local_1a8 [20];
  int in_stack_fffffffffffffe6c;
  example *in_stack_fffffffffffffe70;
  multi_learner *in_stack_fffffffffffffe78;
  warm_cb *in_stack_fffffffffffffe80;
  
  uVar2 = predict_bandit_adf(in_stack_00000050,in_stack_00000048,___msg);
  paVar3 = v_array<ACTION_SCORE::action_score>::operator[](&in_RDI->a_s_adf,(ulong)uVar2);
  (in_RDI->cl_adf).action = paVar3->action + 1;
  paVar3 = v_array<ACTION_SCORE::action_score>::operator[](&in_RDI->a_s_adf,(ulong)uVar2);
  (in_RDI->cl_adf).probability = paVar3->score;
  if ((in_RDI->cl_adf).action != 0) {
    fVar5 = loss_cs(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
    (in_RDI->cl_adf).cost = fVar5;
    if (in_ECX == 2) {
      accumu_costs_iv_adf((warm_cb *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (multi_learner *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    }
    bVar1 = ind_update(in_RDI,in_ECX);
    if (bVar1) {
      learn_bandit_adf(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                       ,in_stack_fffffffffffffe6c);
    }
    *(uint32_t *)(in_RDX + 0x6850) = (in_RDI->cl_adf).action;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10),"No action with non-zero probability found!");
  uVar4 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
  __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void predict_or_learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	uint32_t chosen_action = predict_bandit_adf(data, base, ec);

	auto& cl = data.cl_adf;
	auto& a_s = data.a_s_adf;
	cl.action = a_s[chosen_action].action + 1;
	cl.probability = a_s[chosen_action].score;

	if(!cl.action)
		THROW("No action with non-zero probability found!");

	if (use_cs)
		cl.cost = loss_cs(data, ec.l.cs.costs, cl.action);
	else
		cl.cost = loss(data, ec.l.multi.label, cl.action);

	if (ec_type == INTERACTION)
		accumu_costs_iv_adf(data, base, ec);

	if (ind_update(data, ec_type))
		learn_bandit_adf(data, base, ec, ec_type);

	ec.pred.multiclass = cl.action;
}